

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs6ReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              RecyclableObject *replaceFn)

{
  anon_class_24_3_9375e38d appendReplacement_00;
  Var pvVar1;
  anon_class_24_3_9375e38d appendReplacement;
  RecyclableObject *replaceFn_local;
  JavascriptString *input_local;
  RecyclableObject *thisObj_local;
  ScriptContext *scriptContext_local;
  
  appendReplacement.scriptContext = (ScriptContext **)&replaceFn_local;
  appendReplacement.input = (JavascriptString **)&appendReplacement.replaceFn;
  appendReplacement_00.input = (JavascriptString **)appendReplacement.scriptContext;
  appendReplacement_00.scriptContext = (ScriptContext **)&thisObj_local;
  appendReplacement_00.replaceFn = (RecyclableObject **)appendReplacement.input;
  appendReplacement.replaceFn = (RecyclableObject **)replaceFn;
  replaceFn_local = &input->super_RecyclableObject;
  input_local = (JavascriptString *)thisObj;
  thisObj_local = (RecyclableObject *)scriptContext;
  pvVar1 = RegexEs6ReplaceImpl<Js::RegexHelper::RegexEs6ReplaceImpl(Js::ScriptContext*,Js::RecyclableObject*,Js::JavascriptString*,Js::RecyclableObject*)::__0>
                     (scriptContext,thisObj,input,appendReplacement_00,false);
  return pvVar1;
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, RecyclableObject* replaceFn)
    {
        auto appendReplacement = [&](
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& resultBuilder,
            ArenaAllocator* tempAlloc,
            JavascriptString* matchStr,
            int numberOfCaptures,
            Field(Var)* captures,
            CharCount position)
        {
            // replaceFn Arguments:
            //
            // 0: this
            // 1: matched
            // 2: capture1
            // ...
            // N + 1: capture N
            // N + 2: position
            // N + 3: input

            // Number of captures can be at most 99, so we won't overflow.
            ushort argCount = (ushort) numberOfCaptures + 4;

            PROBE_STACK_NO_DISPOSE(scriptContext, argCount * sizeof(Var));

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Var* args = (Var*) _alloca(argCount * sizeof(Var));

            args[0] = scriptContext->GetLibrary()->GetUndefined();
#pragma prefast(suppress:6386, "The write is within the bounds")
            args[1] = matchStr;
            for (int i = 1; i <= numberOfCaptures; ++i)
            {
                args[i + 1] = captures[i];
            }
            args[numberOfCaptures + 2] = JavascriptNumber::ToVar(position, scriptContext);
            args[numberOfCaptures + 3] = input;
            Js::Var replaceFnResult = threadContext->ExecuteImplicitCall(replaceFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return JavascriptFunction::CallFunction<true>(replaceFn, replaceFn->GetEntryPoint(), Arguments(CallInfo(argCount), args));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceFnResult, scriptContext);

            resultBuilder.Append(replace);
        };
        return RegexEs6ReplaceImpl(scriptContext, thisObj, input, appendReplacement, /* noResult */ false);
    }